

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.cpp
# Opt level: O2

void handleKey(GLFWwindow *window,int key,int scancode,int action,int mode)

{
  if ((uint)key < 0x15d) {
    if (action == 1) {
      _keys[(uint)key] = true;
      if (key == 0x100) {
        glfwSetWindowShouldClose(window,1);
        return;
      }
    }
    else if (action == 0) {
      _keys[(uint)key] = false;
    }
  }
  return;
}

Assistant:

void handleKey(GLFWwindow* window, int key, int scancode, int action, int mode) {
	if (key >= 0 && key <= GLFW_KEY_LAST){
		if (action == GLFW_PRESS){
			_keys[key] = true;
		}else if (action == GLFW_RELEASE){
			_keys[key] = false;
		}
	}

	// exit on ESC
	if (key == GLFW_KEY_ESCAPE && action == GLFW_PRESS) {
		glfwSetWindowShouldClose(window, GL_TRUE);
	}
}